

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

int __thiscall
CVmObjClass::get_prop_from_mod
          (CVmObjClass *this,vm_prop_id_t prop,vm_val_t *val,vm_obj_id_t self,
          vm_obj_id_t *source_obj,uint *argc)

{
  vm_obj_id_t vVar1;
  int iVar2;
  CVmObject *pCVar3;
  undefined4 in_ECX;
  undefined8 in_RDX;
  ushort in_SI;
  long *in_RDI;
  undefined8 in_R8;
  vm_obj_id_t *in_R9;
  vm_obj_id_t mod_obj;
  vm_obj_id_t sc;
  vm_obj_id_t self_00;
  undefined4 in_stack_ffffffffffffffd8;
  vm_prop_id_t prop_00;
  undefined6 in_stack_ffffffffffffffe8;
  
  vVar1 = get_mod_obj((CVmObjClass *)0x310742);
  if (vVar1 != 0) {
    pCVar3 = vm_objp(0);
    iVar2 = (*pCVar3->_vptr_CVmObject[0xd])(pCVar3,(ulong)in_SI,in_RDX,(ulong)vVar1,in_R8,in_R9);
    if (iVar2 != 0) {
      return 1;
    }
  }
  prop_00 = (vm_prop_id_t)((ulong)in_RDX >> 0x30);
  self_00 = (vm_obj_id_t)((ulong)in_R8 >> 0x20);
  iVar2 = (**(code **)(*in_RDI + 0x40))(in_RDI,in_ECX);
  if ((iVar2 != 0) && (iVar2 = (**(code **)(*in_RDI + 0x48))(in_RDI,in_ECX,0), iVar2 != 0)) {
    vm_objp(0);
    iVar2 = get_prop_from_mod((CVmObjClass *)CONCAT26(in_SI,in_stack_ffffffffffffffe8),prop_00,
                              (vm_val_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),self_00,in_R9,
                              (uint *)CONCAT44(iVar2,vVar1));
    return iVar2;
  }
  return 0;
}

Assistant:

int CVmObjClass::get_prop_from_mod(VMG_ vm_prop_id_t prop, vm_val_t *val,
                                   vm_obj_id_t self, vm_obj_id_t *source_obj,
                                   uint *argc)
{
    vm_obj_id_t sc;
    vm_obj_id_t mod_obj;

    /* if we have a modifier object, look it up in the modifier */
    if ((mod_obj = get_mod_obj()) != VM_INVALID_OBJ
        && vm_objp(vmg_ mod_obj)->get_prop(vmg_ prop, val, mod_obj,
                                           source_obj, argc))
    {
        /* got it - return it from the modifier */
        return TRUE;
    }

    /* 
     *   it's not in our modifier(s); check with any intrinsic superclass
     *   modifiers 
     */
    if (get_superclass_count(vmg_ self) != 0
        && (sc = get_superclass(vmg_ self, 0)) != VM_INVALID_OBJ)
    {
        /* we have a superclass - check it recursively */
        return ((CVmObjClass *)vm_objp(vmg_ sc))
            ->get_prop_from_mod(vmg_ prop, val, sc, source_obj, argc);
    }

    /* 
     *   we didn't find it, and we have no superclass, so there's nowhere
     *   else to look - return failure 
     */
    return FALSE;
}